

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiWindowStackData *pIVar1;
  ImGuiWindow_conflict *local_40;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiWindow_conflict *local_20;
  ImGuiWindow_conflict *host_window;
  ImGuiWindow_conflict *window;
  ImGuiContext_conflict *g;
  
  window = (ImGuiWindow_conflict *)GImGui;
  host_window = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) != 0)) {
    if ((GImGui->CurrentWindowStack).Size < 2) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b28,"void ImGui::End()");
    }
  }
  else {
    if ((GImGui->CurrentWindowStack).Size < 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b2b,"void ImGui::End()");
    }
    if (((((host_window->Flags & 0x1000000U) != 0) && ((host_window->Flags & 0x20000000U) == 0)) &&
        ((host_window->field_0x3e1 & 1) == 0)) && ((GImGui->WithinEndChild & 1U) == 0)) {
      __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b2f,"void ImGui::End()");
    }
    if ((host_window->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
      EndColumns();
    }
    if ((host_window->Flags & 0x20000000U) == 0) {
      PopClipRect();
    }
    if ((host_window->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    if (((host_window->DockNode != (ImGuiDockNode *)0x0) &&
        (((byte)host_window->field_0x3e1 >> 2 & 1) != 0)) &&
       (local_20 = host_window->DockNode->HostWindow, local_20 != (ImGuiWindow_conflict *)0x0)) {
      local_30 = operator+(&(host_window->DC).CursorMaxPos,&host_window->WindowPadding);
      local_28 = operator-(&local_30,&local_20->WindowPadding);
      (local_20->DC).CursorMaxPos = local_28;
    }
    pIVar1 = ImVector<ImGuiWindowStackData>::back
                       ((ImVector<ImGuiWindowStackData> *)(window[6].DockStyle.Colors + 5));
    memcpy(&window[7].ScrollbarSizes.y,&pIVar1->ParentLastItemDataBackup,0x3c);
    if ((host_window->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back((ImVector<ImGuiPopupData> *)&window[7].InnerRect);
    }
    pIVar1 = ImVector<ImGuiWindowStackData>::back
                       ((ImVector<ImGuiWindowStackData> *)(window[6].DockStyle.Colors + 5));
    ImGuiStackSizes::CompareWithCurrentState(&pIVar1->StackSizesOnBegin);
    ImVector<ImGuiWindowStackData>::pop_back
              ((ImVector<ImGuiWindowStackData> *)(window[6].DockStyle.Colors + 5));
    if (window[6].DockStyle.Colors[5] == 0) {
      local_40 = (ImGuiWindow_conflict *)0x0;
    }
    else {
      pIVar1 = ImVector<ImGuiWindowStackData>::back
                         ((ImVector<ImGuiWindowStackData> *)(window[6].DockStyle.Colors + 5));
      local_40 = pIVar1->Window;
    }
    SetCurrentWindow(local_40);
    if (window[7].Name != (char *)0x0) {
      SetCurrentViewport((ImGuiWindow_conflict *)window[7].Name,
                         *(ImGuiViewportP_conflict1 **)(window[7].Name + 0x30));
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}